

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::ParseType(Parser *this,Type *type)

{
  BaseType BVar1;
  StructDef *pSVar2;
  allocator local_d1;
  string local_d0;
  Type local_b0;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  Type subtype;
  EnumDef *enum_def;
  Type *type_local;
  Parser *this_local;
  
  if ((this->token_ < 0xd) || (0x18 < this->token_)) {
    if (this->token_ == 4) {
      subtype.enum_def = SymbolTable<flatbuffers::EnumDef>::Lookup(&this->enums_,&this->attribute_);
      if (subtype.enum_def == (EnumDef *)0x0) {
        type->base_type = BASE_TYPE_STRUCT;
        pSVar2 = LookupCreateStruct(this,&this->attribute_);
        type->struct_def = pSVar2;
      }
      else {
        BVar1 = ((subtype.enum_def)->underlying_type).element;
        type->base_type = ((subtype.enum_def)->underlying_type).base_type;
        type->element = BVar1;
        type->struct_def = ((subtype.enum_def)->underlying_type).struct_def;
        type->enum_def = ((subtype.enum_def)->underlying_type).enum_def;
        if (((subtype.enum_def)->is_union & 1U) != 0) {
          type->base_type = BASE_TYPE_UNION;
        }
      }
    }
    else {
      if (this->token_ == 0x5b) {
        Next(this);
        Type::Type((Type *)local_38,BASE_TYPE_NONE,(StructDef *)0x0);
        ParseType(this,(Type *)local_38);
        if (local_38._0_4_ == BASE_TYPE_VECTOR) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_58,"nested vector types not supported (wrap in table first).",
                     &local_59);
          Error(&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::allocator<char>::~allocator((allocator<char> *)&local_59);
        }
        if (local_38._0_4_ == BASE_TYPE_UNION) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_90,
                     "vector of union types not supported (wrap in table first).",&local_91);
          Error(&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        Type::Type(&local_b0,BASE_TYPE_VECTOR,(StructDef *)subtype._0_8_);
        type->base_type = local_b0.base_type;
        type->element = local_b0.element;
        type->struct_def = local_b0.struct_def;
        type->enum_def = local_b0.enum_def;
        type->element = local_38._0_4_;
        Expect(this,0x5d);
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"illegal type syntax",&local_d1);
      Error(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
  }
  else {
    type->base_type = this->token_ - BASE_TYPE_FLOAT;
  }
  Next(this);
  return;
}

Assistant:

void Parser::ParseType(Type &type) {
  if (token_ >= kTokenBOOL && token_ <= kTokenSTRING) {
    type.base_type = static_cast<BaseType>(token_ - kTokenNONE);
  } else {
    if (token_ == kTokenIdentifier) {
      auto enum_def = enums_.Lookup(attribute_);
      if (enum_def) {
        type = enum_def->underlying_type;
        if (enum_def->is_union) type.base_type = BASE_TYPE_UNION;
      } else {
        type.base_type = BASE_TYPE_STRUCT;
        type.struct_def = LookupCreateStruct(attribute_);
      }
    } else if (token_ == '[') {
      Next();
      Type subtype;
      ParseType(subtype);
      if (subtype.base_type == BASE_TYPE_VECTOR) {
        // We could support this, but it will complicate things, and it's
        // easier to work around with a struct around the inner vector.
        Error("nested vector types not supported (wrap in table first).");
      }
      if (subtype.base_type == BASE_TYPE_UNION) {
        // We could support this if we stored a struct of 2 elements per
        // union element.
        Error("vector of union types not supported (wrap in table first).");
      }
      type = Type(BASE_TYPE_VECTOR, subtype.struct_def);
      type.element = subtype.base_type;
      Expect(']');
      return;
    } else {
      Error("illegal type syntax");
    }
  }
  Next();
}